

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O1

duckdb_state duckdb_append_varchar_length(duckdb_appender appender,char *val,idx_t length)

{
  string_t value;
  char *pcVar1;
  duckdb_state dVar2;
  uint uVar3;
  undefined4 uStack_14;
  undefined8 uStack_10;
  
  uVar3 = (uint)length;
  if (uVar3 < 0xd) {
    uStack_10._4_4_ = 0;
    uStack_14 = 0;
    uStack_10._0_4_ = 0;
    pcVar1 = (char *)0x0;
    if (uVar3 != 0) {
      switchD_015ff80e::default(&uStack_14,val,(ulong)(uVar3 & 0xf));
      pcVar1 = (char *)CONCAT44(uStack_10._4_4_,(undefined4)uStack_10);
    }
  }
  else {
    uStack_14 = *(undefined4 *)val;
    pcVar1 = val;
  }
  uStack_10._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  uStack_10._0_4_ = SUB84(pcVar1,0);
  value.value._4_1_ = (undefined1)uStack_14;
  value.value._5_1_ = uStack_14._1_1_;
  value.value._6_1_ = uStack_14._2_1_;
  value.value._7_1_ = uStack_14._3_1_;
  value.value.pointer.length = uVar3;
  value.value._8_4_ = (undefined4)uStack_10;
  value.value._12_4_ = uStack_10._4_4_;
  uStack_10 = pcVar1;
  dVar2 = duckdb_append_internal<duckdb::string_t>(appender,value);
  return dVar2;
}

Assistant:

duckdb_state duckdb_append_varchar_length(duckdb_appender appender, const char *val, idx_t length) {
	return duckdb_append_internal<string_t>(appender, string_t(val, duckdb::UnsafeNumericCast<uint32_t>(length)));
}